

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O0

ErrorCode __thiscall ComponentManager::AddService(ComponentManager *this,CID cid,ISupports *service)

{
  ClassInfo *this_00;
  ClassInfo *local_28;
  ClassInfo *info;
  ISupports *service_local;
  ComponentManager *this_local;
  CID cid_local;
  
  info = (ClassInfo *)service;
  service_local = (ISupports *)this;
  this_local = (ComponentManager *)cid.mId;
  this_00 = (ClassInfo *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/ComponentManager.cpp"
                         ,0xe0);
  ClassInfo::ClassInfo(this_00,(CID *)&this_local,(ISupports *)info);
  local_28 = this_00;
  (**(code **)(info->mCid).mId)();
  JetHead::list<ComponentManager::ClassInfo_*>::push_back(&this->mClasses,&local_28);
  return kNoError;
}

Assistant:

ErrorCode ComponentManager::AddService( CID cid, ISupports *service )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	ClassInfo *info = jh_new ClassInfo( cid, service );
	
	LOG( "Adding cid %s, ISupports %p", cid.toString(), service );
	
	service->AddRef();
	
	mClasses.push_back( info );
	
	return kNoError;
}